

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint filter(uchar *out,uchar *in,uint w,uint h,LodePNGColorMode *color,
           LodePNGEncoderSettings *settings)

{
  uint uVar1;
  undefined4 uVar2;
  size_t sVar3;
  void *pvVar4;
  uint in_ECX;
  uint in_EDX;
  long in_RSI;
  long in_RDI;
  int *in_R8;
  void *in_R9;
  uint testsize;
  LodePNGCompressSettings zlibsettings;
  uchar *dummy;
  uint bestType_2;
  uint type_4;
  size_t smallest_1;
  uchar *attempt_2 [5];
  size_t size [5];
  uchar type_3;
  size_t inindex_1;
  size_t outindex_1;
  size_t sum_1;
  uint count [256];
  uint bestType_1;
  uint type_2;
  size_t bestSum;
  uchar *attempt_1 [5];
  uchar s;
  size_t sum;
  uchar bestType;
  uchar type_1;
  size_t smallest;
  uchar *attempt [5];
  size_t inindex;
  size_t outindex;
  uchar type;
  LodePNGFilterStrategy strategy;
  uint error;
  uint y;
  uint x;
  uchar *prevline;
  size_t bytewidth;
  size_t linebytes;
  uint bpp;
  undefined4 in_stack_fffffffffffffa28;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffffa34;
  undefined7 in_stack_fffffffffffffa38;
  uchar in_stack_fffffffffffffa3f;
  size_t *in_stack_fffffffffffffa40;
  size_t in_stack_fffffffffffffa48;
  uchar **out_00;
  uchar *in_stack_fffffffffffffa50;
  uchar *prevline_00;
  uchar *in_stack_fffffffffffffa58;
  uchar *in_stack_fffffffffffffa60;
  uint local_598;
  uint local_594;
  ulong local_590;
  long alStack_588 [6];
  ulong local_558 [6];
  undefined1 local_521;
  long local_520;
  long local_518;
  ulong local_510;
  int local_508 [256];
  uint local_108;
  uint local_104;
  ulong local_100;
  long alStack_f8 [6];
  byte local_c1;
  ulong local_c0;
  byte local_b2;
  byte local_b1;
  ulong local_b0;
  long alStack_a8 [6];
  long local_78;
  long local_70;
  undefined1 local_61;
  int local_60;
  uint local_5c;
  uint local_58;
  uint local_54;
  long local_50;
  ulong local_48;
  ulong local_40;
  uint local_34;
  void *local_30;
  int *local_28;
  uint local_20;
  uint local_1c;
  long local_18;
  long local_10;
  uint local_4;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_ECX;
  local_1c = in_EDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_34 = lodepng_get_bpp((LodePNGColorMode *)0x35d4e2);
  sVar3 = lodepng_get_raw_size_idat(local_1c,1,local_34);
  local_40 = sVar3 - 1;
  local_48 = (ulong)(local_34 + 7 >> 3);
  local_50 = 0;
  local_5c = 0;
  local_60 = *(int *)((long)local_30 + 0x38);
  if ((*(int *)((long)local_30 + 0x34) != 0) && ((*local_28 == 3 || ((uint)local_28[1] < 8)))) {
    local_60 = 0;
  }
  if (local_34 == 0) {
    local_4 = 0x1f;
  }
  else {
    if ((local_60 < 0) || (4 < local_60)) {
      if (local_60 == 5) {
        local_b0 = 0;
        local_b2 = 0;
        for (local_b1 = 0; local_b1 != 5; local_b1 = local_b1 + 1) {
          pvVar4 = lodepng_malloc(0x35d6fc);
          alStack_a8[local_b1] = (long)pvVar4;
          if (alStack_a8[local_b1] == 0) {
            local_5c = 0x53;
          }
        }
        if (local_5c == 0) {
          for (local_58 = 0; local_58 != local_20; local_58 = local_58 + 1) {
            for (local_b1 = 0; local_b1 != 5; local_b1 = local_b1 + 1) {
              local_c0 = 0;
              filterScanline(in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,
                             in_stack_fffffffffffffa50,in_stack_fffffffffffffa48,
                             (size_t)in_stack_fffffffffffffa40,in_stack_fffffffffffffa3f);
              if (local_b1 == 0) {
                for (local_54 = 0; local_54 != local_40; local_54 = local_54 + 1) {
                  local_c0 = *(byte *)(alStack_a8[0] + (ulong)local_54) + local_c0;
                }
              }
              else {
                for (local_54 = 0; local_54 != local_40; local_54 = local_54 + 1) {
                  local_c1 = *(byte *)(alStack_a8[local_b1] + (ulong)local_54);
                  if (local_c1 < 0x80) {
                    uVar1 = (uint)local_c1;
                  }
                  else {
                    uVar1 = 0xff - local_c1;
                  }
                  local_c0 = uVar1 + local_c0;
                }
              }
              if ((local_b1 == 0) || (local_c0 < local_b0)) {
                local_b2 = local_b1;
                local_b0 = local_c0;
              }
            }
            local_50 = local_18 + local_58 * local_40;
            *(byte *)(local_10 + (ulong)local_58 * (local_40 + 1)) = local_b2;
            for (local_54 = 0; local_54 != local_40; local_54 = local_54 + 1) {
              *(undefined1 *)(local_10 + (ulong)local_58 * (local_40 + 1) + 1 + (ulong)local_54) =
                   *(undefined1 *)(alStack_a8[local_b2] + (ulong)local_54);
            }
          }
        }
        for (local_b1 = '\0'; local_b1 != '\x05'; local_b1 = local_b1 + '\x01') {
          lodepng_free((void *)0x35da45);
        }
      }
      else if (local_60 == 6) {
        local_100 = 0;
        local_108 = 0;
        for (local_104 = 0; local_104 != 5; local_104 = local_104 + 1) {
          pvVar4 = lodepng_malloc(0x35daa3);
          alStack_f8[local_104] = (long)pvVar4;
          if (alStack_f8[local_104] == 0) {
            local_5c = 0x53;
          }
        }
        if (local_5c == 0) {
          for (local_58 = 0; local_58 != local_20; local_58 = local_58 + 1) {
            for (local_104 = 0; local_104 != 5; local_104 = local_104 + 1) {
              local_510 = 0;
              filterScanline(in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,
                             in_stack_fffffffffffffa50,in_stack_fffffffffffffa48,
                             (size_t)in_stack_fffffffffffffa40,in_stack_fffffffffffffa3f);
              lodepng_memset(local_508,0,0x400);
              for (local_54 = 0; local_54 != local_40; local_54 = local_54 + 1) {
                local_508[*(byte *)(alStack_f8[local_104] + (ulong)local_54)] =
                     local_508[*(byte *)(alStack_f8[local_104] + (ulong)local_54)] + 1;
              }
              local_508[local_104] = local_508[local_104] + 1;
              for (local_54 = 0; local_54 != 0x100; local_54 = local_54 + 1) {
                sVar3 = ilog2i(CONCAT17(in_stack_fffffffffffffa3f,in_stack_fffffffffffffa38));
                local_510 = sVar3 + local_510;
              }
              if ((local_104 == 0) || (local_100 < local_510)) {
                local_108 = local_104;
                local_100 = local_510;
              }
            }
            local_50 = local_18 + local_58 * local_40;
            *(char *)(local_10 + (ulong)local_58 * (local_40 + 1)) = (char)local_108;
            for (local_54 = 0; local_54 != local_40; local_54 = local_54 + 1) {
              *(undefined1 *)(local_10 + (ulong)local_58 * (local_40 + 1) + 1 + (ulong)local_54) =
                   *(undefined1 *)(alStack_f8[local_108] + (ulong)local_54);
            }
          }
        }
        for (local_104 = 0; local_104 != 5; local_104 = local_104 + 1) {
          lodepng_free((void *)0x35ddbc);
        }
      }
      else if (local_60 == 8) {
        for (local_58 = 0; local_58 != local_20; local_58 = local_58 + 1) {
          local_518 = (local_40 + 1) * (ulong)local_58;
          local_520 = local_40 * local_58;
          local_521 = *(undefined1 *)(*(long *)((long)local_30 + 0x40) + (ulong)local_58);
          *(undefined1 *)(local_10 + local_518) = local_521;
          filterScanline(in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,
                         in_stack_fffffffffffffa50,in_stack_fffffffffffffa48,
                         (size_t)in_stack_fffffffffffffa40,in_stack_fffffffffffffa3f);
          local_50 = local_18 + local_520;
        }
      }
      else {
        if (local_60 != 7) {
          return 0x58;
        }
        local_590 = 0;
        local_598 = 0;
        lodepng_memcpy(&stack0xfffffffffffffa30,local_30,0x30);
        uVar5 = 1;
        out_00 = (uchar **)0x0;
        prevline_00 = (uchar *)0x0;
        for (local_594 = 0; local_594 != 5; local_594 = local_594 + 1) {
          pvVar4 = lodepng_malloc(0x35df66);
          alStack_588[local_594] = (long)pvVar4;
          if (alStack_588[local_594] == 0) {
            local_5c = 0x53;
          }
        }
        if (local_5c == 0) {
          for (local_58 = 0; local_58 != local_20; local_58 = local_58 + 1) {
            for (local_594 = 0; local_594 != 5; local_594 = local_594 + 1) {
              uVar2 = (undefined4)local_40;
              filterScanline(in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,prevline_00,
                             (size_t)out_00,(size_t)in_stack_fffffffffffffa40,
                             in_stack_fffffffffffffa3f);
              local_558[local_594] = 0;
              in_stack_fffffffffffffa60 = (uchar *)0x0;
              zlib_compress(out_00,in_stack_fffffffffffffa40,
                            (uchar *)CONCAT17(in_stack_fffffffffffffa3f,in_stack_fffffffffffffa38),
                            CONCAT44(in_stack_fffffffffffffa34,uVar5),
                            (LodePNGCompressSettings *)CONCAT44(uVar2,in_stack_fffffffffffffa28));
              lodepng_free((void *)0x35e081);
              if ((local_594 == 0) || (local_558[local_594] < local_590)) {
                local_598 = local_594;
                local_590 = local_558[local_594];
              }
            }
            local_50 = local_18 + local_58 * local_40;
            *(char *)(local_10 + (ulong)local_58 * (local_40 + 1)) = (char)local_598;
            for (local_54 = 0; local_54 != local_40; local_54 = local_54 + 1) {
              *(undefined1 *)(local_10 + (ulong)local_58 * (local_40 + 1) + 1 + (ulong)local_54) =
                   *(undefined1 *)(alStack_588[local_598] + (ulong)local_54);
            }
          }
        }
        for (local_594 = 0; local_594 != 5; local_594 = local_594 + 1) {
          lodepng_free((void *)0x35e1ba);
        }
      }
    }
    else {
      local_61 = (undefined1)local_60;
      for (local_58 = 0; local_58 != local_20; local_58 = local_58 + 1) {
        local_70 = (local_40 + 1) * (ulong)local_58;
        local_78 = local_40 * local_58;
        *(undefined1 *)(local_10 + local_70) = local_61;
        filterScanline(in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,in_stack_fffffffffffffa50
                       ,in_stack_fffffffffffffa48,(size_t)in_stack_fffffffffffffa40,
                       in_stack_fffffffffffffa3f);
        local_50 = local_18 + local_78;
      }
    }
    local_4 = local_5c;
  }
  return local_4;
}

Assistant:

static unsigned filter(unsigned char* out, const unsigned char* in, unsigned w, unsigned h,
                       const LodePNGColorMode* color, const LodePNGEncoderSettings* settings) {
  /*
  For PNG filter method 0
  out must be a buffer with as size: h + (w * h * bpp + 7u) / 8u, because there are
  the scanlines with 1 extra byte per scanline
  */

  unsigned bpp = lodepng_get_bpp(color);
  /*the width of a scanline in bytes, not including the filter type*/
  size_t linebytes = lodepng_get_raw_size_idat(w, 1, bpp) - 1u;

  /*bytewidth is used for filtering, is 1 when bpp < 8, number of bytes per pixel otherwise*/
  size_t bytewidth = (bpp + 7u) / 8u;
  const unsigned char* prevline = 0;
  unsigned x, y;
  unsigned error = 0;
  LodePNGFilterStrategy strategy = settings->filter_strategy;

  if(settings->filter_palette_zero && (color->colortype == LCT_PALETTE || color->bitdepth < 8)) {
    /*if the filter_palette_zero setting is enabled, override the filter strategy with
    zero for all scanlines for palette and less-than-8-bitdepth images*/
    strategy = LFS_ZERO;
  }

  if(bpp == 0) return 31; /*error: invalid color type*/

  if(strategy >= LFS_ZERO && strategy <= LFS_FOUR) {
    unsigned char type = (unsigned char)strategy;
    for(y = 0; y != h; ++y) {
      size_t outindex = (1 + linebytes) * y; /*the extra filterbyte added to each row*/
      size_t inindex = linebytes * y;
      out[outindex] = type; /*filter type byte*/
      filterScanline(&out[outindex + 1], &in[inindex], prevline, linebytes, bytewidth, type);
      prevline = &in[inindex];
    }
  } else if(strategy == LFS_MINSUM) {
    /*adaptive filtering: independently for each row, try all five filter types and select the one that produces the
    smallest sum of absolute values per row.*/
    unsigned char* attempt[5]; /*five filtering attempts, one for each filter type*/
    size_t smallest = 0;
    unsigned char type, bestType = 0;

    for(type = 0; type != 5; ++type) {
      attempt[type] = (unsigned char*)lodepng_malloc(linebytes);
      if(!attempt[type]) error = 83; /*alloc fail*/
    }

    if(!error) {
      for(y = 0; y != h; ++y) {
        /*try the 5 filter types*/
        for(type = 0; type != 5; ++type) {
          size_t sum = 0;
          filterScanline(attempt[type], &in[y * linebytes], prevline, linebytes, bytewidth, type);

          /*calculate the sum of the result*/
          if(type == 0) {
            for(x = 0; x != linebytes; ++x) sum += (unsigned char)(attempt[type][x]);
          } else {
            for(x = 0; x != linebytes; ++x) {
              /*For differences, each byte should be treated as signed, values above 127 are negative
              (converted to signed char). Filtertype 0 isn't a difference though, so use unsigned there.
              This means filtertype 0 is almost never chosen, but that is justified.*/
              unsigned char s = attempt[type][x];
              sum += s < 128 ? s : (255U - s);
            }
          }

          /*check if this is smallest sum (or if type == 0 it's the first case so always store the values)*/
          if(type == 0 || sum < smallest) {
            bestType = type;
            smallest = sum;
          }
        }

        prevline = &in[y * linebytes];

        /*now fill the out values*/
        out[y * (linebytes + 1)] = bestType; /*the first byte of a scanline will be the filter type*/
        for(x = 0; x != linebytes; ++x) out[y * (linebytes + 1) + 1 + x] = attempt[bestType][x];
      }
    }

    for(type = 0; type != 5; ++type) lodepng_free(attempt[type]);
  } else if(strategy == LFS_ENTROPY) {
    unsigned char* attempt[5]; /*five filtering attempts, one for each filter type*/
    size_t bestSum = 0;
    unsigned type, bestType = 0;
    unsigned count[256];

    for(type = 0; type != 5; ++type) {
      attempt[type] = (unsigned char*)lodepng_malloc(linebytes);
      if(!attempt[type]) error = 83; /*alloc fail*/
    }

    if(!error) {
      for(y = 0; y != h; ++y) {
        /*try the 5 filter types*/
        for(type = 0; type != 5; ++type) {
          size_t sum = 0;
          filterScanline(attempt[type], &in[y * linebytes], prevline, linebytes, bytewidth, type);
          lodepng_memset(count, 0, 256 * sizeof(*count));
          for(x = 0; x != linebytes; ++x) ++count[attempt[type][x]];
          ++count[type]; /*the filter type itself is part of the scanline*/
          for(x = 0; x != 256; ++x) {
            sum += ilog2i(count[x]);
          }
          /*check if this is smallest sum (or if type == 0 it's the first case so always store the values)*/
          if(type == 0 || sum > bestSum) {
            bestType = type;
            bestSum = sum;
          }
        }

        prevline = &in[y * linebytes];

        /*now fill the out values*/
        out[y * (linebytes + 1)] = bestType; /*the first byte of a scanline will be the filter type*/
        for(x = 0; x != linebytes; ++x) out[y * (linebytes + 1) + 1 + x] = attempt[bestType][x];
      }
    }

    for(type = 0; type != 5; ++type) lodepng_free(attempt[type]);
  } else if(strategy == LFS_PREDEFINED) {
    for(y = 0; y != h; ++y) {
      size_t outindex = (1 + linebytes) * y; /*the extra filterbyte added to each row*/
      size_t inindex = linebytes * y;
      unsigned char type = settings->predefined_filters[y];
      out[outindex] = type; /*filter type byte*/
      filterScanline(&out[outindex + 1], &in[inindex], prevline, linebytes, bytewidth, type);
      prevline = &in[inindex];
    }
  } else if(strategy == LFS_BRUTE_FORCE) {
    /*brute force filter chooser.
    deflate the scanline after every filter attempt to see which one deflates best.
    This is very slow and gives only slightly smaller, sometimes even larger, result*/
    size_t size[5];
    unsigned char* attempt[5]; /*five filtering attempts, one for each filter type*/
    size_t smallest = 0;
    unsigned type = 0, bestType = 0;
    unsigned char* dummy;
    LodePNGCompressSettings zlibsettings;
    lodepng_memcpy(&zlibsettings, &settings->zlibsettings, sizeof(LodePNGCompressSettings));
    /*use fixed tree on the attempts so that the tree is not adapted to the filtertype on purpose,
    to simulate the true case where the tree is the same for the whole image. Sometimes it gives
    better result with dynamic tree anyway. Using the fixed tree sometimes gives worse, but in rare
    cases better compression. It does make this a bit less slow, so it's worth doing this.*/
    zlibsettings.btype = 1;
    /*a custom encoder likely doesn't read the btype setting and is optimized for complete PNG
    images only, so disable it*/
    zlibsettings.custom_zlib = 0;
    zlibsettings.custom_deflate = 0;
    for(type = 0; type != 5; ++type) {
      attempt[type] = (unsigned char*)lodepng_malloc(linebytes);
      if(!attempt[type]) error = 83; /*alloc fail*/
    }
    if(!error) {
      for(y = 0; y != h; ++y) /*try the 5 filter types*/ {
        for(type = 0; type != 5; ++type) {
          unsigned testsize = (unsigned)linebytes;
          /*if(testsize > 8) testsize /= 8;*/ /*it already works good enough by testing a part of the row*/

          filterScanline(attempt[type], &in[y * linebytes], prevline, linebytes, bytewidth, type);
          size[type] = 0;
          dummy = 0;
          zlib_compress(&dummy, &size[type], attempt[type], testsize, &zlibsettings);
          lodepng_free(dummy);
          /*check if this is smallest size (or if type == 0 it's the first case so always store the values)*/
          if(type == 0 || size[type] < smallest) {
            bestType = type;
            smallest = size[type];
          }
        }
        prevline = &in[y * linebytes];
        out[y * (linebytes + 1)] = bestType; /*the first byte of a scanline will be the filter type*/
        for(x = 0; x != linebytes; ++x) out[y * (linebytes + 1) + 1 + x] = attempt[bestType][x];
      }
    }
    for(type = 0; type != 5; ++type) lodepng_free(attempt[type]);
  }
  else return 88; /* unknown filter strategy */

  return error;
}